

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

void * threadTask(void *arg)

{
  FILE *__stream;
  _Bool _Var1;
  int iVar2;
  uint *puVar3;
  _Bool processing_result;
  int result;
  uint32_t messages_processed;
  apx_allocator_t *self;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    do {
      iVar2 = sem_wait((sem_t *)((long)arg + 0x10));
      __stream = _stderr;
      if (iVar2 != 0) {
        puVar3 = (uint *)__errno_location();
        fprintf(__stream,"[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d\n",
                (ulong)*puVar3);
        return (void *)0x0;
      }
      _Var1 = apx_allocator_processEvent((apx_allocator_t *)arg);
    } while (_Var1);
  }
  return (void *)0x0;
}

Assistant:

static THREAD_PROTO(threadTask,arg)
{
   if(arg!=0)
   {

      apx_allocator_t *self;
      uint32_t messages_processed=0;
      self = (apx_allocator_t*) arg;
      for(;;)
      {
#ifdef _MSC_VER
         DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
         if (result == WAIT_OBJECT_0)
#else
         int result = sem_wait(&self->semaphore);
         if (result == 0)
#endif
         {
            bool processing_result;
            messages_processed++;
            processing_result = apx_allocator_processEvent(self);
            if (!processing_result)
            {
               break;
            }
         }
         else
         {
#ifdef _MSC_VER
            DWORD lastError = GetLastError();
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, lastError=%d", lastError);
#else
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d", errno);
#endif
            break;
         }
      }
      //APX_LOG_DEBUG("[APX_ALLOCATOR]: messages_processed: %u\n", messages_processed);
   }
   THREAD_RETURN(0);
}